

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O1

void Gia_CollectSuper_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  long lVar3;
  int Entry;
  Gia_Obj_t *pGVar4;
  
  while ((((ulong)pObj & 1) == 0 && (uVar2 = (uint)*(undefined8 *)pObj, (~uVar2 & 0x9fffffff) != 0))
        ) {
    if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEnable.c"
                    ,0x35,"void Gia_CollectSuper_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    Gia_CollectSuper_rec
              (p,(Gia_Obj_t *)
                 ((ulong)(uVar2 >> 0x1d & 1) | (ulong)(pObj + -(ulong)(uVar2 & 0x1fffffff))),vSuper)
    ;
    uVar2 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
    pObj = (Gia_Obj_t *)((ulong)(uVar2 >> 0x1d & 1) | (ulong)(pObj + -(ulong)(uVar2 & 0x1fffffff)));
  }
  pGVar4 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pGVar4) && (pGVar4 < pGVar1 + p->nObjs)) {
    Entry = (int)((ulong)((long)pGVar4 - (long)pGVar1) >> 2) * -0x55555555;
    if (0 < (long)vSuper->nSize) {
      lVar3 = 0;
      do {
        if (vSuper->pArray[lVar3] == Entry) {
          return;
        }
        lVar3 = lVar3 + 1;
      } while (vSuper->nSize != lVar3);
    }
    Vec_IntPush(vSuper,Entry);
    return;
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collects the supergate.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_CollectSuper_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) )
    {
        Vec_IntPushUnique( vSuper, Gia_ObjId(p, Gia_Regular(pObj)) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    // go through the branches
    Gia_CollectSuper_rec( p, Gia_ObjChild0(pObj), vSuper );
    Gia_CollectSuper_rec( p, Gia_ObjChild1(pObj), vSuper );
}